

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int choose_format(archive_read *a)

{
  int iVar1;
  int local_2c;
  int local_28;
  int best_bid_slot;
  int best_bid;
  int bid;
  int i;
  int slots;
  archive_read *a_local;
  
  local_28 = -1;
  local_2c = -1;
  a->format = a->formats;
  best_bid = 0;
  do {
    if (0xf < best_bid) {
      if (local_2c < 0) {
        archive_set_error(&a->archive,0x54,"No formats registered");
        a_local._4_4_ = -0x1e;
      }
      else if (local_28 < 1) {
        archive_set_error(&a->archive,0x54,"Unrecognized archive format");
        a_local._4_4_ = -0x1e;
      }
      else {
        a_local._4_4_ = local_2c;
      }
      return a_local._4_4_;
    }
    if (a->format->bid != (_func_int_archive_read_ptr_int *)0x0) {
      iVar1 = (*a->format->bid)(a,local_28);
      if (iVar1 == -0x1e) {
        return -0x1e;
      }
      if (a->filter->position != 0) {
        __archive_read_seek(a,0,0);
      }
      if ((local_28 < iVar1) || (local_2c < 0)) {
        local_2c = best_bid;
        local_28 = iVar1;
      }
    }
    best_bid = best_bid + 1;
    a->format = a->format + 1;
  } while( true );
}

Assistant:

static int
choose_format(struct archive_read *a)
{
	int slots;
	int i;
	int bid, best_bid;
	int best_bid_slot;

	slots = sizeof(a->formats) / sizeof(a->formats[0]);
	best_bid = -1;
	best_bid_slot = -1;

	/* Set up a->format for convenience of bidders. */
	a->format = &(a->formats[0]);
	for (i = 0; i < slots; i++, a->format++) {
		if (a->format->bid) {
			bid = (a->format->bid)(a, best_bid);
			if (bid == ARCHIVE_FATAL)
				return (ARCHIVE_FATAL);
			if (a->filter->position != 0)
				__archive_read_seek(a, 0, SEEK_SET);
			if ((bid > best_bid) || (best_bid_slot < 0)) {
				best_bid = bid;
				best_bid_slot = i;
			}
		}
	}

	/*
	 * There were no bidders; this is a serious programmer error
	 * and demands a quick and definitive abort.
	 */
	if (best_bid_slot < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "No formats registered");
		return (ARCHIVE_FATAL);
	}

	/*
	 * There were bidders, but no non-zero bids; this means we
	 * can't support this stream.
	 */
	if (best_bid < 1) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unrecognized archive format");
		return (ARCHIVE_FATAL);
	}

	return (best_bid_slot);
}